

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O1

JL_STATUS OutputDictionaryEnd(JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  JL_STATUS JVar1;
  
  JVar1 = AddNewLineAndIndentation(JsonBuffer,SUB41(((uint)OutputFlags & 2) >> 1,0),StackDepth);
  if (JVar1 != JL_STATUS_SUCCESS) {
    return JVar1;
  }
  JVar1 = JlBufferAdd(JsonBuffer,"}",1);
  return JVar1;
}

Assistant:

JL_STATUS
    OutputDictionaryEnd
    (
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;

    jlStatus = AddNewLineAndIndentation(
        JsonBuffer,
        OutputFlags & JL_OUTPUT_FLAGS_INDENT ? true : false,
        StackDepth );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlBufferAdd( JsonBuffer, "}", 1 );
    }

    return jlStatus;
}